

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EmptyQueueExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyQueueExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Token openBrace;
  Token closeBrace;
  EmptyQueueExpressionSyntax *this_00;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (EmptyQueueExpressionSyntax *)allocate(this,0x30,8);
  openBrace.kind = args->kind;
  openBrace._2_1_ = args->field_0x2;
  openBrace.numFlags.raw = (args->numFlags).raw;
  openBrace.rawLen = args->rawLen;
  openBrace.info = args->info;
  closeBrace.kind = args_1->kind;
  closeBrace._2_1_ = args_1->field_0x2;
  closeBrace.numFlags.raw = (args_1->numFlags).raw;
  closeBrace.rawLen = args_1->rawLen;
  closeBrace.info = args_1->info;
  slang::syntax::EmptyQueueExpressionSyntax::EmptyQueueExpressionSyntax
            (this_00,openBrace,closeBrace);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }